

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O3

void file_callback(log_Event *ev)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char buf [64];
  char acStack_58 [72];
  
  sVar3 = strftime(acStack_58,0x40,"%Y-%m-%d %H:%M:%S",(tm *)ev->time);
  acStack_58[sVar3] = '\0';
  iVar1 = ev->level + 0x20;
  iVar2 = ev->level + 0x3f;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  fprintf((FILE *)ev->udata,"%s %-7s %s:%d: ",acStack_58,level_strings[iVar2 >> 5],ev->file,
          (ulong)(uint)ev->line);
  vfprintf((FILE *)ev->udata,ev->fmt,ev);
  fputc(10,(FILE *)ev->udata);
  fflush((FILE *)ev->udata);
  return;
}

Assistant:

static void file_callback(log_Event *ev) {
    char buf[64];
    buf[strftime(buf, sizeof(buf), "%Y-%m-%d %H:%M:%S", ev->time)] = '\0';
    fprintf(ev->udata, "%s %-7s %s:%d: ", buf, get_level_string(ev->level),
            ev->file, ev->line);
    vfprintf(ev->udata, ev->fmt, ev->ap);
    fprintf(ev->udata, "\n");
    fflush(ev->udata);
}